

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::readEncodingCompression(MatroskaDemuxer *this,MatroskaTrack *track)

{
  uchar *__dest;
  int local_3c;
  uint8_t *puStack_38;
  int size;
  uint8_t *data;
  int64_t num;
  uint32_t id;
  int res;
  MatroskaTrack *track_local;
  MatroskaDemuxer *this_local;
  
  _id = track;
  track_local = (MatroskaTrack *)this;
  num._4_4_ = ebml_read_master(this,(uint32_t *)&num);
  this_local._4_4_ = num._4_4_;
  if (-1 < num._4_4_) {
    _id->encodingAlgo = 0;
    do {
      if ((num._4_4_ != 0) || (num._0_4_ = ebml_peek_id(this,&this->level_up), (uint32_t)num == 0))
      goto LAB_002caa5b;
      if (0 < this->level_up) {
        this->level_up = this->level_up + -1;
        goto LAB_002caa5b;
      }
      if ((uint32_t)num == 0x4254) {
        num._4_4_ = ebml_read_uint(this,(uint32_t *)&num,(int64_t *)&data);
        if (-1 < num._4_4_) {
          _id->encodingAlgo = (int32_t)data;
        }
      }
      else if ((uint32_t)num == 0x4255) {
        num._4_4_ = ebml_read_binary(this,(uint32_t *)&num,&stack0xffffffffffffffc8,&local_3c);
        if ((-1 < num._4_4_) && (0 < local_3c)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&_id->encodingAlgoPriv,(long)local_3c);
          __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&_id->encodingAlgoPriv);
          memcpy(__dest,puStack_38,(long)local_3c);
        }
      }
      else {
        num._4_4_ = ebml_read_skip(this);
      }
    } while (this->level_up == 0);
    this->level_up = this->level_up + -1;
LAB_002caa5b:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MatroskaDemuxer::readEncodingCompression(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    track->encodingAlgo = 0;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        case MATROSKA_ID_ENCODINGCOMPALGO:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            track->encodingAlgo = static_cast<int32_t>(num);
            break;
        }
        case MATROSKA_ID_ENCODINGCOMPSETTINGS:
        {
            uint8_t *data;
            int size;
            if ((res = ebml_read_binary(&id, &data, &size)) < 0)
                break;
            if (size > 0)
            {
                track->encodingAlgoPriv.resize(size);
                memcpy(track->encodingAlgoPriv.data(), data, size);
            }
            break;
        }
        default:
            res = ebml_read_skip();
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}